

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::TryGetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  Mutex *this_00;
  flat_hash_set<const_google::protobuf::internal::DescriptorTable_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  *this_01;
  ctrl_t *pcVar1;
  DescriptorPool *pDVar2;
  string *psVar3;
  pointer pcVar4;
  size_t sVar5;
  ulong uVar6;
  DescriptorByNameEq *this_02;
  slot_type pDVar7;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 *puVar11;
  bool bVar12;
  ushort uVar13;
  DescriptorTable **key;
  DescriptorPool *pDVar14;
  uint64_t uVar15;
  slot_type *ppDVar16;
  size_t sVar17;
  anon_union_8_1_a8a14541_for_iterator_2 aVar18;
  reference ppDVar19;
  _Storage<const_google::protobuf::Message_*,_true> _Var20;
  char *pcVar21;
  ulong uVar22;
  pointer pcVar23;
  pointer pcVar24;
  undefined1 uVar25;
  uchar *bytes_1;
  ulong uVar26;
  pointer pcVar27;
  undefined1 (*pauVar28) [16];
  uchar *bytes_2;
  uint uVar29;
  ulong uVar30;
  DescriptorTable *pDVar31;
  uint64_t v_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  optional<const_google::protobuf::Message_*> oVar34;
  iterator iVar35;
  string_view str;
  string_view v_00;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  string_view rhs_03;
  uint64_t v;
  uchar *bytes;
  iterator it;
  __m128i match;
  char *local_c8;
  iterator local_80;
  ctrl_t *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  iterator local_40;
  
  this_00 = &this->mutex_;
  absl::lts_20250127::Mutex::ReaderLock(this_00);
  oVar34 = FindInTypeMap(this,type);
  absl::lts_20250127::Mutex::ReaderUnlock(this_00);
  if ((oVar34.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
       super__Optional_payload_base<const_google::protobuf::Message_*>._M_engaged &
      oVar34.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload._M_value !=
      (Message *)0x0) != 0) {
    return (Message *)
           oVar34.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload;
  }
  pDVar2 = type->file_->pool_;
  pDVar14 = DescriptorPool::generated_pool();
  if (pDVar2 != pDVar14) {
    return (Message *)0x0;
  }
  psVar3 = type->file_->name_;
  pcVar4 = (psVar3->_M_dataplus)._M_p;
  pDVar31 = (DescriptorTable *)psVar3->_M_string_length;
  this_01 = &this->files_;
  pcVar23 = pcVar4;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            (&this_01->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            );
  if (1 < (this->files_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    uVar15 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                       (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,pcVar4,pDVar31);
    uVar26 = uVar15 ^ (ulong)pDVar31;
    uVar30 = (this_01->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if (uVar30 == 1) {
      ppDVar16 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 ::soo_slot(&this_01->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                           );
      pDVar7 = *ppDVar16;
      rhs_02._M_str = pcVar23;
      rhs_02._M_len = (size_t)pcVar4;
      bVar12 = DescriptorByNameEq::operator()((DescriptorByNameEq *)pDVar7,pDVar31,rhs_02);
      if (bVar12) {
        pcVar21 = pDVar7->filename;
        sVar17 = strlen(pcVar21);
        uVar15 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                           (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,pcVar21,
                            sVar17);
        if (uVar26 != (uVar15 ^ sVar17)) {
LAB_002f32a1:
          __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfbf,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::AssertHashEqConsistent(const std::basic_string_view<char> &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                       );
        }
      }
    }
    else {
      if (uVar30 == 0) goto LAB_002f3479;
      if (uVar30 < 0x11) {
        ppDVar16 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   ::slot_array(&this_01->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                               );
        uVar30 = (this->files_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar28 = (undefined1 (*) [16])
                   (this->files_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar30 < 0xf) {
          if (8 < uVar30) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          pcVar23 = (pointer)0x8080808080808080;
          uVar30 = *(ulong *)(*pauVar28 + uVar30) & 0x8080808080808080;
          if (uVar30 != 0x8080808080808080) {
            uVar30 = uVar30 ^ 0x8080808080808080;
            do {
              lVar9 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              this_02 = *(DescriptorByNameEq **)
                         ((long)ppDVar16 + ((ulong)((uint)lVar9 & 0xfffffff8) - 8));
              rhs_00._M_str = pcVar23;
              rhs_00._M_len = (size_t)pcVar4;
              bVar12 = DescriptorByNameEq::operator()(this_02,pDVar31,rhs_00);
              if (bVar12) {
                pcVar21 = *(char **)(this_02 + 0x10);
                sVar17 = strlen(pcVar21);
                uVar15 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                                   (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                                    pcVar21,sVar17);
                if (uVar26 != (uVar15 ^ sVar17)) goto LAB_002f32a1;
              }
              uVar30 = uVar30 & uVar30 - 1;
            } while (uVar30 != 0);
          }
        }
        else {
          uVar30 = (this->files_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          pcVar24 = (pointer)(uVar30 >> 1);
          pcVar23 = pcVar24;
          pcVar27 = pcVar24;
          if (1 < uVar30) {
            while( true ) {
              auVar32 = *pauVar28;
              uVar29 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar32[0xf] >> 7) << 0xf);
              if (uVar29 != 0xffff) {
                uVar29 = ~uVar29;
                do {
                  uVar8 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  if ((char)(*pauVar28)[uVar8] < '\0') {
                    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x79d,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                                 );
                  }
                  pDVar7 = ppDVar16[uVar8];
                  rhs_03._M_str = pcVar23;
                  rhs_03._M_len = (size_t)pcVar4;
                  bVar12 = DescriptorByNameEq::operator()
                                     ((DescriptorByNameEq *)pDVar7,pDVar31,rhs_03);
                  if (bVar12) {
                    pcVar21 = pDVar7->filename;
                    sVar17 = strlen(pcVar21);
                    uVar15 = absl::lts_20250127::hash_internal::MixingHashState::
                             CombineContiguousImpl
                                       (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                                        pcVar21,sVar17);
                    if (uVar26 != (uVar15 ^ sVar17)) goto LAB_002f32a1;
                  }
                  pcVar27 = pcVar27 + -1;
                  uVar13 = (ushort)(uVar29 - 1) & (ushort)uVar29;
                  uVar29 = CONCAT22((short)(uVar29 - 1 >> 0x10),uVar13);
                } while (uVar13 != 0);
              }
              if (pcVar27 == (pointer)0x0) break;
              ppDVar16 = ppDVar16 + 0x10;
              puVar11 = *pauVar28;
              pauVar28 = pauVar28 + 1;
              if (puVar11[0xf] == -1) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            }
          }
          if (pcVar24 < (pointer)((this->files_).
                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                  .settings_.
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.size_ >> 1)) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            (&this_01->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            );
  sVar5 = (this_01->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  aVar18 = (anon_union_8_1_a8a14541_for_iterator_2)this_00;
  if (sVar5 != 1) {
    if (sVar5 != 0) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
      ::prefetch_heap_block
                (&this_01->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                );
      uVar15 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                         (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,pcVar4,pDVar31)
      ;
      uVar30 = (this_01->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar30 == 1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = std::basic_string_view<char>]"
                     );
      }
      if (uVar30 != 0) {
        if ((uVar30 + 1 & uVar30) != 0) {
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar26 = (uVar15 ^ (ulong)pDVar31) * -0x234dd359734ecb13;
        local_c8 = (char *)(((uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                              (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                              (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                              (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38) >> 7 ^
                            (ulong)(this->files_).
                                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                   .settings_.
                                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                   .
                                   super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                   .value.heap_or_soo_.heap.control >> 0xc) & uVar30);
        local_70 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   ::control(&this_01->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                            );
        uVar25 = (undefined1)(uVar26 >> 0x38);
        auVar32 = ZEXT216(CONCAT11(uVar25,uVar25) & 0x7f7f);
        auVar32 = pshuflw(auVar32,auVar32,0);
        local_68 = auVar32._0_4_;
        uVar26 = 0;
        local_80.ctrl_ = (ctrl_t *)this;
        uStack_64 = local_68;
        uStack_60 = local_68;
        uStack_5c = local_68;
        do {
          pcVar1 = local_70 + (long)local_c8;
          local_58 = *pcVar1;
          cStack_57 = pcVar1[1];
          cStack_56 = pcVar1[2];
          cStack_55 = pcVar1[3];
          cStack_54 = pcVar1[4];
          cStack_53 = pcVar1[5];
          cStack_52 = pcVar1[6];
          cStack_51 = pcVar1[7];
          cStack_50 = pcVar1[8];
          cStack_4f = pcVar1[9];
          cStack_4e = pcVar1[10];
          cStack_4d = pcVar1[0xb];
          cStack_4c = pcVar1[0xc];
          cStack_4b = pcVar1[0xd];
          cStack_4a = pcVar1[0xe];
          cStack_49 = pcVar1[0xf];
          auVar32[0] = -((ctrl_t)local_68 == local_58);
          auVar32[1] = -(local_68._1_1_ == cStack_57);
          auVar32[2] = -(local_68._2_1_ == cStack_56);
          auVar32[3] = -(local_68._3_1_ == cStack_55);
          auVar32[4] = -((ctrl_t)uStack_64 == cStack_54);
          auVar32[5] = -(uStack_64._1_1_ == cStack_53);
          auVar32[6] = -(uStack_64._2_1_ == cStack_52);
          auVar32[7] = -(uStack_64._3_1_ == cStack_51);
          auVar32[8] = -((ctrl_t)uStack_60 == cStack_50);
          auVar32[9] = -(uStack_60._1_1_ == cStack_4f);
          auVar32[10] = -(uStack_60._2_1_ == cStack_4e);
          auVar32[0xb] = -(uStack_60._3_1_ == cStack_4d);
          auVar32[0xc] = -((ctrl_t)uStack_5c == cStack_4c);
          auVar32[0xd] = -(uStack_5c._1_1_ == cStack_4b);
          auVar32[0xe] = -(uStack_5c._2_1_ == cStack_4a);
          auVar32[0xf] = -(uStack_5c._3_1_ == cStack_49);
          uVar13 = (ushort)(SUB161(auVar32 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar32[0xf] >> 7) << 0xf;
          uVar29 = (uint)uVar13;
          pcVar21 = local_c8;
          while (uVar13 != 0) {
            uVar8 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            ppDVar16 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       ::slot_array(&this_01->
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                   );
            rhs._M_str = pcVar21;
            rhs._M_len = (size_t)pcVar4;
            bVar12 = DescriptorByNameEq::operator()
                               ((DescriptorByNameEq *)ppDVar16[(ulong)(local_c8 + uVar8) & uVar30],
                                pDVar31,rhs);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = aVar18;
            iVar35 = (iterator)(auVar10 << 0x40);
            if (bVar12) {
              iVar35 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       ::iterator_at(&this_01->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                     ,(ulong)(local_c8 + uVar8) & uVar30);
              local_80.ctrl_ = iVar35.ctrl_;
            }
            aVar18 = iVar35.field_1;
            if (bVar12) break;
            uVar13 = (ushort)(uVar29 - 1) & (ushort)uVar29;
            uVar29 = CONCAT22((short)(uVar29 - 1 >> 0x10),uVar13);
          }
          if (uVar13 != 0) {
LAB_002f2ff9:
            bVar12 = false;
            uVar22 = uVar26;
          }
          else {
            auVar33[0] = -(local_58 == kEmpty);
            auVar33[1] = -(cStack_57 == kEmpty);
            auVar33[2] = -(cStack_56 == kEmpty);
            auVar33[3] = -(cStack_55 == kEmpty);
            auVar33[4] = -(cStack_54 == kEmpty);
            auVar33[5] = -(cStack_53 == kEmpty);
            auVar33[6] = -(cStack_52 == kEmpty);
            auVar33[7] = -(cStack_51 == kEmpty);
            auVar33[8] = -(cStack_50 == kEmpty);
            auVar33[9] = -(cStack_4f == kEmpty);
            auVar33[10] = -(cStack_4e == kEmpty);
            auVar33[0xb] = -(cStack_4d == kEmpty);
            auVar33[0xc] = -(cStack_4c == kEmpty);
            auVar33[0xd] = -(cStack_4b == kEmpty);
            auVar33[0xe] = -(cStack_4a == kEmpty);
            auVar33[0xf] = -(cStack_49 == kEmpty);
            if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar33 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar33 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar33 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar33 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar33 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar33 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar33 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                cStack_49 == kEmpty) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              ::AssertNotDebugCapacity
                        (&this_01->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                        );
              local_80.ctrl_ = (ctrl_t *)0x0;
              goto LAB_002f2ff9;
            }
            uVar6 = (this_01->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                    ).settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_;
            if (uVar6 == 0) goto LAB_002f3479;
            uVar22 = uVar26 + 0x10;
            if (uVar6 < uVar22) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe37,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = std::basic_string_view<char>]"
                           );
            }
            local_c8 = (char *)((ulong)(local_c8 + uVar26 + 0x10) & uVar30);
            bVar12 = true;
          }
          uVar26 = uVar22;
        } while (bVar12);
        goto LAB_002f31a0;
      }
    }
LAB_002f3479:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            (&this_01->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            );
  if (1 < (this->files_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    ppDVar16 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ::soo_slot(&this_01->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                         );
    rhs_01._M_str = pcVar23;
    rhs_01._M_len = (size_t)pcVar4;
    bVar12 = DescriptorByNameEq::operator()((DescriptorByNameEq *)*ppDVar16,pDVar31,rhs_01);
    if (bVar12) {
      aVar18.slot_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                     ::soo_slot(&this_01->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                               );
      local_80.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
      goto LAB_002f31a0;
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            (&this_01->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            );
  local_80.ctrl_ = (ctrl_t *)0x0;
LAB_002f31a0:
  local_80.field_1 = aVar18;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            (&this_01->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            );
  local_40.ctrl_ = (ctrl_t *)0x0;
  bVar12 = absl::lts_20250127::container_internal::operator==(&local_80,&local_40);
  if (bVar12) {
    pDVar31 = (DescriptorTable *)0x0;
  }
  else {
    ppDVar19 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ::iterator::operator*(&local_80);
    pDVar31 = *ppDVar19;
  }
  if (pDVar31 == (DescriptorTable *)0x0) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0x19a);
    str._M_str = "File appears to be in generated pool but wasn\'t registered: ";
    str._M_len = 0x3c;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_80,str);
    psVar3 = type->file_->name_;
    v_00._M_str = (psVar3->_M_dataplus)._M_p;
    v_00._M_len = psVar3->_M_string_length;
    absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_80,v_00);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_80);
    return (Message *)0x0;
  }
  absl::lts_20250127::Mutex::Lock(this_00);
  oVar34 = FindInTypeMap(this,type);
  _Var20 = oVar34.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload;
  if (((undefined1  [16])
       oVar34.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
       super__Optional_payload_base<const_google::protobuf::Message_*> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    internal::RegisterFileLevelMetadata(pDVar31);
    oVar34 = FindInTypeMap(this,type);
    _Var20 = oVar34.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload;
    if (((undefined1  [16])
         oVar34.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
         super__Optional_payload_base<const_google::protobuf::Message_*> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                 ,0x1aa,"result.has_value()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_80);
    }
  }
  absl::lts_20250127::Mutex::Unlock(this_00);
  return (Message *)_Var20;
}

Assistant:

const Message* GeneratedMessageFactory::TryGetPrototype(
    const Descriptor* type) {
  absl::optional<const Message*> result;
  {
    absl::ReaderMutexLock lock(&mutex_);
    result = FindInTypeMap(type);
    if (result.has_value() && *result != nullptr) {
      return *result;
    }
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return nullptr;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  const internal::DescriptorTable* registration_data =
      FindInFileMap(type->file()->name());
  if (registration_data == nullptr) {
    ABSL_DLOG(FATAL) << "File appears to be in generated pool but wasn't "
                        "registered: "
                     << type->file()->name();
    return nullptr;
  }

  {
    absl::WriterMutexLock lock(&mutex_);

    // Check if another thread preempted us.
    result = FindInTypeMap(type);
    if (!result.has_value()) {
      // Nope.  OK, register everything.
      internal::RegisterFileLevelMetadata(registration_data);
      // Should be here now.
      result = FindInTypeMap(type);
      ABSL_DCHECK(result.has_value());
    }
  }

  return *result;
}